

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  uint8_t *puVar2;
  value_type *pvVar3;
  uint *puVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char_range key;
  char_range key_00;
  char_range key_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  plain_bonsai_map<int> map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  undefined1 local_1d8 [32];
  pointer puStack_1b8;
  uint64_t uStack_1b0;
  unsigned_long auStack_1a8 [2];
  uint32_t *puStack_198;
  uint64_t uStack_190;
  uint32_t local_188 [2];
  uint64_t local_180;
  pointer *local_178;
  uint64_t local_170;
  pointer puStack_168;
  pointer puStack_160;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *p_Stack_158;
  uint64_t uStack_150;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> _Stack_148;
  uchar auStack_140 [8];
  undefined8 *puStack_138;
  uchar local_130 [8];
  undefined8 uStack_128;
  uchar auStack_120 [8];
  undefined8 *puStack_118;
  uchar auStack_110 [8];
  undefined8 uStack_108;
  uchar auStack_100 [8];
  undefined8 *puStack_f8;
  uchar local_f0 [8];
  undefined8 uStack_e8;
  uchar auStack_e0 [8];
  long *plStack_d8;
  uchar auStack_d0 [8];
  long lStack_c8;
  uchar auStack_c0 [136];
  uint64_t local_38;
  
  local_1d8._0_8_ = local_1d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Aoba","");
  puStack_1b8 = auStack_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_1b8,"Yun","");
  puStack_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_198,"Hajime","");
  local_178 = &puStack_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Hihumi","");
  p_Stack_158 = &_Stack_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&p_Stack_158,"Kou","");
  puStack_138 = &uStack_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_138,"Rin","");
  puStack_118 = &uStack_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_118,"Hazuki","");
  puStack_f8 = &uStack_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_f8,"Umiko","");
  plVar6 = &lStack_c8;
  plStack_d8 = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_d8,"Nene","");
  __l._M_len = 9;
  __l._M_array = (iterator)local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_210,__l,(allocator_type *)&local_1f8);
  lVar7 = -0x120;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
  local_1d8._8_8_ = 0x20;
  local_180 = 0;
  local_178 = (pointer *)((ulong)local_178 & 0xffffffff00000000);
  local_188[0] = 0;
  local_1d8._16_8_ = 0;
  local_1d8._24_8_ = 0;
  puStack_1b8 = (pointer)0x0;
  uStack_1b0 = 0;
  auStack_1a8[0] = 0;
  auStack_1a8[1] = 0;
  puStack_198 = (uint32_t *)0x0;
  uStack_190 = 0;
  local_38 = 0;
  auStack_c0[0x10] = '\0';
  auStack_c0[0x11] = '\0';
  auStack_c0[0x12] = '\0';
  auStack_c0[0x13] = '\0';
  auStack_c0[0x14] = '\0';
  auStack_c0[0x15] = '\0';
  auStack_c0[0x16] = '\0';
  auStack_c0[0x17] = '\0';
  auStack_c0[0x18] = '\0';
  auStack_c0[0x19] = '\0';
  auStack_c0[0x1a] = '\0';
  auStack_c0[0x1b] = '\0';
  auStack_c0[0x1c] = '\0';
  auStack_c0[0x1d] = '\0';
  auStack_c0[0x1e] = '\0';
  auStack_c0[0x1f] = '\0';
  auStack_c0[0x20] = '\0';
  auStack_c0[0x21] = '\0';
  auStack_c0[0x22] = '\0';
  auStack_c0[0x23] = '\0';
  auStack_c0[0x24] = '\0';
  auStack_c0[0x25] = '\0';
  auStack_c0[0x26] = '\0';
  auStack_c0[0x27] = '\0';
  auStack_c0[0x28] = '\0';
  auStack_c0[0x29] = '\0';
  auStack_c0[0x2a] = '\0';
  auStack_c0[0x2b] = '\0';
  auStack_c0[0x2c] = '\0';
  auStack_c0[0x2d] = '\0';
  auStack_c0[0x2e] = '\0';
  auStack_c0[0x2f] = '\0';
  auStack_c0[0x30] = '\0';
  auStack_c0[0x31] = '\0';
  auStack_c0[0x32] = '\0';
  auStack_c0[0x33] = '\0';
  auStack_c0[0x34] = '\0';
  auStack_c0[0x35] = '\0';
  auStack_c0[0x36] = '\0';
  auStack_c0[0x37] = '\0';
  auStack_c0[0x38] = '\0';
  auStack_c0[0x39] = '\0';
  auStack_c0[0x3a] = '\0';
  auStack_c0[0x3b] = '\0';
  auStack_c0[0x3c] = '\0';
  auStack_c0[0x3d] = '\0';
  auStack_c0[0x3e] = '\0';
  auStack_c0[0x3f] = '\0';
  auStack_c0[0x40] = '\0';
  auStack_c0[0x41] = '\0';
  auStack_c0[0x42] = '\0';
  auStack_c0[0x43] = '\0';
  local_170 = 0;
  puStack_168 = (pointer)0x0;
  puStack_160 = (pointer)0x0;
  p_Stack_158 = (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)0x0;
  uStack_150 = 0;
  _Stack_148._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
  auStack_140[0] = '\0';
  auStack_140[1] = '\0';
  auStack_140[2] = '\0';
  auStack_140[3] = '\0';
  auStack_140[4] = '\0';
  auStack_140[5] = '\0';
  auStack_140[6] = '\0';
  auStack_140[7] = '\0';
  puStack_138 = (undefined8 *)0x0;
  local_130[0] = '\0';
  local_130[1] = '\0';
  local_130[2] = '\0';
  local_130[3] = '\0';
  local_130[4] = '\0';
  local_130[5] = '\0';
  local_130[6] = '\0';
  local_130[7] = '\0';
  uStack_128._0_1_ = '\0';
  uStack_128._1_1_ = '\0';
  uStack_128._2_1_ = '\0';
  uStack_128._3_1_ = '\0';
  uStack_128._4_1_ = '\0';
  uStack_128._5_1_ = '\0';
  uStack_128._6_1_ = '\0';
  uStack_128._7_1_ = '\0';
  auStack_120[0] = '\0';
  auStack_120[1] = '\0';
  auStack_120[2] = '\0';
  auStack_120[3] = '\0';
  auStack_120[4] = '\0';
  auStack_120[5] = '\0';
  auStack_120[6] = '\0';
  auStack_120[7] = '\0';
  puStack_118 = (undefined8 *)0x0;
  auStack_110[0] = '\0';
  auStack_110[1] = '\0';
  auStack_110[2] = '\0';
  auStack_110[3] = '\0';
  auStack_110[4] = '\0';
  auStack_110[5] = '\0';
  auStack_110[6] = '\0';
  auStack_110[7] = '\0';
  uStack_108._0_1_ = '\0';
  uStack_108._1_1_ = '\0';
  uStack_108._2_1_ = '\0';
  uStack_108._3_1_ = '\0';
  uStack_108._4_1_ = '\0';
  uStack_108._5_1_ = '\0';
  uStack_108._6_1_ = '\0';
  uStack_108._7_1_ = '\0';
  auStack_100[0] = '\0';
  auStack_100[1] = '\0';
  auStack_100[2] = '\0';
  auStack_100[3] = '\0';
  auStack_100[4] = '\0';
  auStack_100[5] = '\0';
  auStack_100[6] = '\0';
  auStack_100[7] = '\0';
  puStack_f8 = (undefined8 *)0x0;
  local_f0[0] = '\0';
  local_f0[1] = '\0';
  local_f0[2] = '\0';
  local_f0[3] = '\0';
  local_f0[4] = '\0';
  local_f0[5] = '\0';
  local_f0[6] = '\0';
  local_f0[7] = '\0';
  uStack_e8._0_1_ = '\0';
  uStack_e8._1_1_ = '\0';
  uStack_e8._2_1_ = '\0';
  uStack_e8._3_1_ = '\0';
  uStack_e8._4_1_ = '\0';
  uStack_e8._5_1_ = '\0';
  uStack_e8._6_1_ = '\0';
  uStack_e8._7_1_ = '\0';
  auStack_e0[0] = '\0';
  auStack_e0[1] = '\0';
  auStack_e0[2] = '\0';
  auStack_e0[3] = '\0';
  auStack_e0[4] = '\0';
  auStack_e0[5] = '\0';
  auStack_e0[6] = '\0';
  auStack_e0[7] = '\0';
  plStack_d8 = (long *)0x0;
  auStack_d0[0] = '\0';
  auStack_d0[1] = '\0';
  auStack_d0[2] = '\0';
  auStack_d0[3] = '\0';
  auStack_d0[4] = '\0';
  auStack_d0[5] = '\0';
  auStack_d0[6] = '\0';
  auStack_d0[7] = '\0';
  lStack_c8 = 0;
  auStack_c0[0] = '\0';
  auStack_c0[1] = '\0';
  auStack_c0[2] = '\0';
  auStack_c0[3] = '\0';
  auStack_c0[4] = '\0';
  auStack_c0[5] = '\0';
  auStack_c0[6] = '\0';
  auStack_c0[7] = '\0';
  auStack_c0[8] = '\0';
  auStack_c0[9] = '\0';
  auStack_c0[10] = '\0';
  auStack_c0[0xb] = '\0';
  auStack_c0[0xc] = '\0';
  auStack_c0[0xd] = '\0';
  auStack_c0[0xe] = '\0';
  auStack_c0[0xf] = '\0';
  auStack_c0[0x44] = '\0';
  auStack_c0[0x45] = '\0';
  auStack_c0[0x46] = '\0';
  auStack_c0[0x47] = '\0';
  auStack_c0[0x48] = '\0';
  auStack_c0[0x49] = '\0';
  auStack_c0[0x4a] = '\0';
  auStack_c0[0x4b] = '\0';
  auStack_c0[0x4c] = '\0';
  auStack_c0[0x4d] = '\0';
  auStack_c0[0x4e] = '\0';
  auStack_c0[0x4f] = '\0';
  auStack_c0[0x50] = '\0';
  auStack_c0[0x51] = '\0';
  auStack_c0[0x52] = '\0';
  auStack_c0[0x53] = '\0';
  auStack_c0[0x54] = '\0';
  auStack_c0[0x55] = '\0';
  auStack_c0[0x56] = '\0';
  auStack_c0[0x57] = '\0';
  auStack_c0[0x58] = '\0';
  auStack_c0[0x59] = '\0';
  auStack_c0[0x5a] = '\0';
  auStack_c0[0x5b] = '\0';
  auStack_c0[0x5c] = '\0';
  auStack_c0[0x5d] = '\0';
  auStack_c0[0x5e] = '\0';
  auStack_c0[0x5f] = '\0';
  auStack_c0[0x60] = '\0';
  auStack_c0[0x61] = '\0';
  auStack_c0[0x62] = '\0';
  auStack_c0[99] = '\0';
  auStack_c0[100] = '\0';
  auStack_c0[0x65] = '\0';
  auStack_c0[0x66] = '\0';
  auStack_c0[0x67] = '\0';
  auStack_c0[0x68] = '\0';
  auStack_c0[0x69] = '\0';
  auStack_c0[0x6a] = '\0';
  auStack_c0[0x6b] = '\0';
  auStack_c0[0x6c] = '\0';
  auStack_c0[0x6d] = '\0';
  auStack_c0[0x6e] = '\0';
  auStack_c0[0x6f] = '\0';
  auStack_c0[0x70] = '\0';
  auStack_c0[0x71] = '\0';
  auStack_c0[0x72] = '\0';
  auStack_c0[0x73] = '\0';
  auStack_c0[0x74] = '\0';
  auStack_c0[0x75] = '\0';
  auStack_c0[0x76] = '\0';
  auStack_c0[0x77] = '\0';
  auStack_c0[0x78] = '\0';
  auStack_c0[0x79] = '\0';
  auStack_c0[0x7a] = '\0';
  auStack_c0[0x7b] = '\0';
  auStack_c0._124_8_ = 0;
  uVar10 = (uint)((ulong)((long)local_210.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_210.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar10) {
    lVar7 = 8;
    uVar9 = 0;
    do {
      puVar2 = *(uint8_t **)
                ((long)local_210.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
      key.end = puVar2 + *(long *)((long)&((local_210.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar7) + 1;
      key.begin = puVar2;
      pvVar3 = poplar::
               map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
               ::update((map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                         *)local_1d8,key);
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x20;
      *pvVar3 = (value_type)uVar9;
    } while ((uVar10 & 0x7fffffff) != uVar9);
    if (0 < (int)uVar10) {
      lVar7 = 8;
      uVar9 = 1;
      iVar8 = 1;
      do {
        puVar2 = *(uint8_t **)
                  ((long)local_210.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
        key_00.end = puVar2 + *(long *)((long)&((local_210.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar7) + 1;
        key_00.begin = puVar2;
        puVar4 = (uint *)poplar::
                         map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                         ::find((map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                                 *)local_1d8,key_00);
        if ((puVar4 == (uint *)0x0) || (uVar9 != *puVar4)) goto LAB_0010381f;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            *(char **)((long)local_210.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8)
                            ,*(long *)((long)&((local_210.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,*puVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        lVar1 = (1 - (ulong)(uVar10 & 0x7fffffff)) + uVar9;
        lVar7 = lVar7 + 0x20;
        uVar9 = uVar9 + 1;
      } while (lVar1 != 1);
    }
  }
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Hotaru","");
  key_01.end = (uint8_t *)((long)local_1f8 + local_1f0 + 1);
  key_01.begin = (uint8_t *)local_1f8;
  pvVar3 = poplar::
           map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
           ::find((map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
                   *)local_1d8,key_01);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  iVar8 = 1;
  if (pvVar3 == (value_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hotaru: ",8);
    plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#keys = ",8);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    iVar8 = 0;
    std::ostream::flush();
  }
LAB_0010381f:
  poplar::
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
  ~map((map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
        *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  return iVar8;
}

Assistant:

int main() {
    std::vector<std::string> keys = {"Aoba", "Yun", "Hajime", "Hihumi", "Kou", "Rin", "Hazuki", "Umiko", "Nene"};
    const auto num_keys = static_cast<int>(keys.size());

    poplar::plain_bonsai_map<int> map;

    try {
        for (int i = 0; i < num_keys; ++i) {
            int* ptr = map.update(keys[i]);
            *ptr = i + 1;
        }
        for (int i = 0; i < num_keys; ++i) {
            const int* ptr = map.find(keys[i]);
            if (ptr == nullptr or *ptr != i + 1) {
                return 1;
            }
            std::cout << keys[i] << ": " << *ptr << std::endl;
        }
        {
            const int* ptr = map.find("Hotaru");
            if (ptr != nullptr) {
                return 1;
            }
            std::cout << "Hotaru: " << -1 << std::endl;
        }
    } catch (const poplar::exception& ex) {
        std::cerr << ex.what() << std::endl;
        return 1;
    }

    std::cout << "#keys = " << map.size() << std::endl;

    return 0;
}